

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O3

int ravi_auto(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  lua_Integer lVar4;
  
  iVar1 = lua_gettop(L);
  iVar2 = raviV_getauto(L);
  lua_pushboolean(L,iVar2);
  iVar2 = raviV_getmincodesize(L);
  lua_pushinteger(L,(long)iVar2);
  iVar2 = raviV_getminexeccount(L);
  lua_pushinteger(L,(long)iVar2);
  if (0 < iVar1) {
    iVar2 = lua_toboolean(L,1);
    raviV_setauto(L,iVar2);
    if (iVar1 != 1) {
      lVar3 = lua_tointegerx(L,2,(int *)0x0);
      iVar2 = -1;
      if (iVar1 == 3) {
        lVar4 = lua_tointegerx(L,3,(int *)0x0);
        iVar2 = (int)lVar4;
      }
      if (0 < (int)lVar3) {
        raviV_setmincodesize(L,(int)lVar3);
      }
      if (0 < iVar2) {
        raviV_setminexeccount(L,iVar2);
      }
    }
  }
  return 3;
}

Assistant:

static int ravi_auto(lua_State *L) {
  int n = lua_gettop(L);
  lua_pushboolean(L, raviV_getauto(L));
  lua_pushinteger(L, raviV_getmincodesize(L));
  lua_pushinteger(L, raviV_getminexeccount(L));
  if (n >= 1) raviV_setauto(L, lua_toboolean(L, 1));
  int min_code_size = (n >= 2) ? (int)(lua_tointeger(L, 2)) : -1;
  int min_exec_count = (n == 3) ? (int)(lua_tointeger(L, 3)) : -1;
  if (min_code_size >= 1) raviV_setmincodesize(L, min_code_size);
  if (min_exec_count >= 1) raviV_setminexeccount(L, min_exec_count);
  return 3;
}